

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<std::complex<long_double>_>::Resize
          (TPZVec<std::complex<long_double>_> *this,int64_t newsize,complex<long_double> *object)

{
  undefined1 auVar1 [16];
  ostream *this_00;
  ulong uVar2;
  complex<long_double> *pcVar3;
  undefined8 *puVar4;
  undefined8 *in_RDX;
  ulong in_RSI;
  long in_RDI;
  int64_t i;
  int64_t large;
  complex<long_double> *newstore;
  ulong local_80;
  complex<long_double> *local_68;
  long local_40;
  complex<long_double> *local_20;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      local_20 = (complex<long_double> *)0x0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar2 = SUB168(auVar1 * ZEXT816(0x20),0);
      if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      local_20 = (complex<long_double> *)operator_new__(uVar2);
      if (in_RSI != 0) {
        local_68 = local_20;
        do {
          std::complex<long_double>::complex(local_68,(longdouble)0,(longdouble)0);
          local_68 = local_68 + 1;
        } while (local_68 != local_20 + in_RSI);
      }
    }
    local_80 = in_RSI;
    if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
      local_80 = *(ulong *)(in_RDI + 0x10);
    }
    for (local_40 = 0; local_40 < (long)local_80; local_40 = local_40 + 1) {
      puVar4 = (undefined8 *)(*(long *)(in_RDI + 8) + local_40 * 0x20);
      pcVar3 = local_20 + local_40;
      *(undefined8 *)pcVar3->_M_value = *puVar4;
      *(undefined8 *)((long)pcVar3->_M_value + 8) = puVar4[1];
      *(undefined8 *)((long)pcVar3->_M_value + 0x10) = puVar4[2];
      *(undefined8 *)((long)pcVar3->_M_value + 0x18) = puVar4[3];
    }
    for (; local_40 < (long)in_RSI; local_40 = local_40 + 1) {
      pcVar3 = local_20 + local_40;
      *(undefined8 *)pcVar3->_M_value = *in_RDX;
      *(undefined8 *)((long)pcVar3->_M_value + 8) = in_RDX[1];
      *(undefined8 *)((long)pcVar3->_M_value + 0x10) = in_RDX[2];
      *(undefined8 *)((long)pcVar3->_M_value + 0x18) = in_RDX[3];
    }
    if (*(long *)(in_RDI + 8) != 0) {
      if (*(void **)(in_RDI + 8) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 8));
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    *(complex<long_double> **)(in_RDI + 8) = local_20;
    *(ulong *)(in_RDI + 0x10) = in_RSI;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}